

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O1

void __thiscall
duckdb::WindowPartitionGlobalSinkState::WindowPartitionGlobalSinkState
          (WindowPartitionGlobalSinkState *this,WindowGlobalSinkState *gsink,
          BoundWindowExpression *wexpr)

{
  ClientContext *context;
  const_reference pvVar1;
  
  context = gsink->context;
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(gsink->op->super_PhysicalOperator).children,0);
  PartitionGlobalSinkState::PartitionGlobalSinkState
            (&this->super_PartitionGlobalSinkState,context,&wexpr->partitions,&wexpr->orders,
             &pvVar1->_M_data->types,&wexpr->partitions_stats,
             (gsink->op->super_PhysicalOperator).estimated_cardinality);
  (this->super_PartitionGlobalSinkState)._vptr_PartitionGlobalSinkState =
       (_func_int **)&PTR__WindowPartitionGlobalSinkState_019c60b8;
  this->gsink = gsink;
  (this->window_hash_groups).
  super_vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_hash_groups).
  super_vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_hash_groups).
  super_vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

WindowPartitionGlobalSinkState(WindowGlobalSinkState &gsink, const BoundWindowExpression &wexpr)
	    : PartitionGlobalSinkState(gsink.context, wexpr.partitions, wexpr.orders, gsink.op.children[0].get().GetTypes(),
	                               wexpr.partitions_stats, gsink.op.estimated_cardinality),
	      gsink(gsink) {
	}